

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::pushGLStates(RenderTarget *this)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  GLenum error;
  RenderTarget *this_local;
  
  bVar1 = anon_unknown.dwarf_c483c::isActive(this->m_id);
  if ((bVar1) || (uVar2 = (*this->_vptr_RenderTarget[3])(this,1), (uVar2 & 1) != 0)) {
    uVar2 = glGetError();
    if (uVar2 != 0) {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"OpenGL error (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
      poVar3 = std::operator<<(poVar3,") detected in user code, ");
      poVar3 = std::operator<<(poVar3,"you should check for errors with glGetError()");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    glPushClientAttrib(0xffffffff);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x1bf,"glPushClientAttrib(GL_CLIENT_ALL_ATTRIB_BITS)");
    glPushAttrib(0xffffffff);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x1c0,"glPushAttrib(GL_ALL_ATTRIB_BITS)");
    glMatrixMode(0x1700);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x1c2,"glMatrixMode(GL_MODELVIEW)");
    glPushMatrix();
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x1c3,"glPushMatrix()");
    glMatrixMode(0x1701);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x1c4,"glMatrixMode(GL_PROJECTION)");
    glPushMatrix();
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x1c5,"glPushMatrix()");
    glMatrixMode(0x1702);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x1c6,"glMatrixMode(GL_TEXTURE)");
    glPushMatrix();
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x1c7,"glPushMatrix()");
  }
  resetGLStates(this);
  return;
}

Assistant:

void RenderTarget::pushGLStates()
{
    if (isActive(m_id) || setActive(true))
    {
        #ifdef SFML_DEBUG
            // make sure that the user didn't leave an unchecked OpenGL error
            GLenum error = glGetError();
            if (error != GL_NO_ERROR)
            {
                err() << "OpenGL error (" << error << ") detected in user code, "
                      << "you should check for errors with glGetError()"
                      << std::endl;
            }
        #endif

        #ifndef SFML_OPENGL_ES
            glCheck(glPushClientAttrib(GL_CLIENT_ALL_ATTRIB_BITS));
            glCheck(glPushAttrib(GL_ALL_ATTRIB_BITS));
        #endif
        glCheck(glMatrixMode(GL_MODELVIEW));
        glCheck(glPushMatrix());
        glCheck(glMatrixMode(GL_PROJECTION));
        glCheck(glPushMatrix());
        glCheck(glMatrixMode(GL_TEXTURE));
        glCheck(glPushMatrix());
    }

    resetGLStates();
}